

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O0

People * __thiscall tcmalloc::FixedAllocator<People>::Alloc(FixedAllocator<People> *this)

{
  FixedAllocator<People> *this_local;
  
  if ((this->inited & 1U) == 0) {
    if ((this->construct & 1U) == 0) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                    ,0x18,"T *tcmalloc::FixedAllocator<People>::Alloc() [T = People]");
    }
    Init(this);
  }
  if (this->freelist_ == (void *)0x0) {
    this_local = (FixedAllocator<People> *)AllocFromArea(this);
  }
  else {
    this_local = (FixedAllocator<People> *)AllocFromFreeList(this);
  }
  return (People *)this_local;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }